

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

void __thiscall CVmObjDict::save_to_file(CVmObjDict *this,CVmFile *fp)

{
  long lVar1;
  long lVar2;
  uint32_t tmp;
  long lVar3;
  long lVar4;
  char b_2 [4];
  char b [4];
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_38._0_4_ = *(undefined4 *)((this->super_CVmObject).ext_ + 0x20);
  CVmFile::write_bytes(fp,(char *)&local_38,4);
  lVar3 = ftell((FILE *)fp->fp_);
  lVar1 = fp->seek_base_;
  local_38 = (CVmFile *)((ulong)local_38._4_4_ << 0x20);
  CVmFile::write_bytes(fp,(char *)&local_38,4);
  local_30 = 0;
  uStack_28 = 0;
  local_38 = fp;
  CVmHashTable::enum_entries
            (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),save_file_cb,&local_38);
  lVar4 = ftell((FILE *)fp->fp_);
  lVar2 = fp->seek_base_;
  fseek((FILE *)fp->fp_,(lVar3 - lVar1) + lVar2,0);
  local_3c = (undefined4)local_30;
  CVmFile::write_bytes(fp,(char *)&local_3c,4);
  fseek((FILE *)fp->fp_,(lVar4 - lVar2) + fp->seek_base_,0);
  return;
}

Assistant:

void CVmObjDict::save_to_file(VMG_ CVmFile *fp)
{
    long cnt_pos;
    long end_pos;
    save_file_ctx ctx;

    /* write the current comparator object */
    fp->write_uint4(get_ext()->comparator_);
    
    /* remember the starting seek position and write a placeholder count */
    cnt_pos = fp->get_pos();
    fp->write_uint4(0);

    /* enumerate the entries to write out each one */
    ctx.fp = fp;
    ctx.cnt = 0;
    ctx.vmg = VMGLOB_ADDR;
    get_ext()->hashtab_->enum_entries(&save_file_cb, &ctx);

    /* remember our position for a moment */
    end_pos = fp->get_pos();

    /* go back and write out the symbol count prefix */
    fp->set_pos(cnt_pos);
    fp->write_uint4(ctx.cnt);

    /* seek back to the end */
    fp->set_pos(end_pos);
}